

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O2

void look_mon_desc(char *buf,size_t max,wchar_t m_idx)

{
  _Bool _Var1;
  int iVar2;
  monster *mon;
  char *pcVar3;
  char *pcVar4;
  
  mon = cave_monster(cave,m_idx);
  if (mon != (monster *)0x0) {
    _Var1 = monster_is_destroyed(mon);
    if (mon->hp < mon->maxhp) {
      iVar2 = (mon->hp * 100) / (int)mon->maxhp;
      if (iVar2 < 0x3c) {
        if (iVar2 < 0x19) {
          if (iVar2 < 10) {
            pcVar3 = "almost destroyed";
            pcVar4 = "almost dead";
          }
          else {
            pcVar3 = "badly damaged";
            pcVar4 = "badly wounded";
          }
        }
        else {
          pcVar3 = "damaged";
          pcVar4 = "wounded";
        }
      }
      else {
        pcVar3 = "somewhat damaged";
        pcVar4 = "somewhat wounded";
      }
    }
    else {
      pcVar3 = "undamaged";
      pcVar4 = "unhurt";
    }
    if (_Var1) {
      pcVar4 = pcVar3;
    }
    my_strcpy(buf,pcVar4,max);
    if (mon->m_timed[0] != 0) {
      my_strcat(buf,", asleep",max);
    }
    if (mon->m_timed[6] != 0) {
      my_strcat(buf,", held",max);
    }
    if (mon->m_timed[7] != 0) {
      my_strcat(buf,", disenchanted",max);
    }
    if (mon->m_timed[2] != 0) {
      my_strcat(buf,", confused",max);
    }
    if (mon->m_timed[3] != 0) {
      my_strcat(buf,", afraid",max);
    }
    if (mon->m_timed[1] != 0) {
      my_strcat(buf,", stunned",max);
    }
    if (mon->m_timed[4] != 0) {
      my_strcat(buf,", slowed",max);
    }
    if (mon->m_timed[5] != 0) {
      my_strcat(buf,", hasted",max);
    }
    _Var1 = flag_has_dbg(mon->race->flags,0xc,0x24,"mon->race->flags","RF_PLAYER");
    if (_Var1) {
      pcVar4 = ", neutral";
      if ((mon->target).midx < L'\0') {
        pcVar4 = ", hostile";
      }
      my_strcat(buf,pcVar4,max);
      return;
    }
  }
  return;
}

Assistant:

void look_mon_desc(char *buf, size_t max, int m_idx)
{
	struct monster *mon = cave_monster(cave, m_idx);

	bool living = true;

	if (!mon) return;

	/* Determine if the monster is "living" (vs "undead") */
	if (monster_is_destroyed(mon)) living = false;

	/* Assess health */
	if (mon->hp >= mon->maxhp) {
		/* No damage */
		my_strcpy(buf, (living ? "unhurt" : "undamaged"), max);
	} else {
		/* Calculate a health "percentage" */
		int perc = 100L * mon->hp / mon->maxhp;

		if (perc >= 60)
			my_strcpy(buf, (living ? "somewhat wounded" : "somewhat damaged"),
					  max);
		else if (perc >= 25)
			my_strcpy(buf, (living ? "wounded" : "damaged"), max);
		else if (perc >= 10)
			my_strcpy(buf, (living ? "badly wounded" : "badly damaged"), max);
		else
			my_strcpy(buf, (living ? "almost dead" : "almost destroyed"), max);
	}

	/* Effect status */
	if (mon->m_timed[MON_TMD_SLEEP]) my_strcat(buf, ", asleep", max);
	if (mon->m_timed[MON_TMD_HOLD]) my_strcat(buf, ", held", max);
	if (mon->m_timed[MON_TMD_DISEN]) my_strcat(buf, ", disenchanted", max);
	if (mon->m_timed[MON_TMD_CONF]) my_strcat(buf, ", confused", max);
	if (mon->m_timed[MON_TMD_FEAR]) my_strcat(buf, ", afraid", max);
	if (mon->m_timed[MON_TMD_STUN]) my_strcat(buf, ", stunned", max);
	if (mon->m_timed[MON_TMD_SLOW]) my_strcat(buf, ", slowed", max);
	if (mon->m_timed[MON_TMD_FAST]) my_strcat(buf, ", hasted", max);

	/* Hostility */
	if (rf_has(mon->race->flags, RF_PLAYER)) {
		if (mon->target.midx < 0) {
			/* Hostile monsters */
			my_strcat(buf, ", hostile", max);
		} else {
			/* Not hostile to the player */
			my_strcat(buf, ", neutral", max);
		}
	}
}